

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sVertexAttributeBindingTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Stress::anon_unknown_0::SingleBindingCase::SingleBindingCase
          (SingleBindingCase *this,Context *ctx,char *name,int flags)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  long *local_1c0;
  long local_1b0 [2];
  undefined1 local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"draw test pattern",0x11);
  bVar7 = SUB41(flags & 1U,0);
  if ((flags & 1U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,", attribute offset (unaligned)",0x1e);
  }
  if ((flags & 2U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,", attribute offset (aligned)",0x1c);
  }
  if ((flags & 4U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", 2 attributes",0xe);
  }
  if ((flags & 8U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,", 2 attributes (some components shared)",0x27);
  }
  if ((flags & 0x10U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,", buffer offset aligned",0x17);
  }
  if ((flags & 0x20U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,", buffer offset unaligned",0x19);
  }
  if ((flags & 0x40U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,", buffer stride unaligned",0x19);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  if ((flags & 3U) == 0) {
    bVar7 = (flags & 0x60U) != 0;
  }
  tcu::TestCase::TestCase((TestCase *)this,ctx->m_testCtx,name,(char *)local_1c0);
  (this->super_BindingRenderCase).super_TestCase.m_context = ctx;
  (this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BindingRenderCase_02167870;
  (this->super_BindingRenderCase).m_unalignedData = bVar7;
  (this->super_BindingRenderCase).m_vao = 0;
  (this->super_BindingRenderCase).m_program = (ShaderProgram *)0x0;
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  uVar1 = 0x20;
  if ((flags & 0x10U) == 0) {
    uVar1 = (flags << 0x1a) >> 0x1f & 0x13;
  }
  uVar4 = 4 - (uVar1 & 3);
  if ((uVar1 & 3) == 0) {
    uVar4 = 0;
  }
  uVar2 = 3;
  if ((flags & 1U) == 0) {
    uVar2 = uVar4 & (flags << 0x1e) >> 0x1f;
  }
  iVar3 = 0;
  uVar4 = 8;
  if ((flags & 8U) == 0) {
    uVar4 = -(uint)((flags & 4U) == 0) | 0x10;
  }
  uVar5 = uVar4 + 0x10;
  if (uVar4 + 0x10 < uVar2 + 0x10) {
    uVar5 = uVar2 + 0x10;
  }
  uVar6 = uVar5 & 3;
  (this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SingleBindingCase_021677f0;
  if ((flags & 0x40U) == 0) {
    iVar3 = 4 - uVar6;
    if (uVar6 == 0) {
      iVar3 = 0;
    }
  }
  else if (uVar6 == 0) {
    iVar3 = 0xd;
  }
  (this->m_spec).bufferOffset = uVar1;
  (this->m_spec).bufferStride = iVar3 + uVar5;
  (this->m_spec).positionAttrOffset = uVar2;
  (this->m_spec).colorAttrOffset = uVar4;
  (this->m_spec).hasColorAttr = (flags & 0xcU) != 0;
  this->m_buf = 0;
  return;
}

Assistant:

SingleBindingCase::SingleBindingCase (Context& ctx, const char* name, int flags)
	: BindingRenderCase	(ctx, name, genTestDescription(flags).c_str(), isDataUnaligned(flags))
	, m_spec			(genTestSpec(flags))
	, m_buf				(0)
{
	DE_ASSERT(!((flags & FLAG_ATTRIB_UNALIGNED) && (flags & FLAG_ATTRIB_ALIGNED)));
	DE_ASSERT(!((flags & FLAG_ATTRIB_ALIGNED) && (flags & FLAG_BUF_UNALIGNED_STRIDE)));

	DE_ASSERT(isDataUnaligned(flags));
}